

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2lax_polygon_shape.cc
# Opt level: O0

void __thiscall
S2LaxPolygonShape::Init
          (S2LaxPolygonShape *this,
          vector<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>,_std::allocator<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>_>_>
          *loops)

{
  pointer this_00;
  bool bVar1;
  size_type __n;
  reference __args;
  Loop *loop;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>,_std::allocator<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>_>_>
  *__range1;
  undefined1 local_30 [8];
  vector<absl::Span<const_Vector3<double>_>,_std::allocator<absl::Span<const_Vector3<double>_>_>_>
  spans;
  vector<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>,_std::allocator<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>_>_>
  *loops_local;
  S2LaxPolygonShape *this_local;
  
  spans.
  super__Vector_base<absl::Span<const_Vector3<double>_>,_std::allocator<absl::Span<const_Vector3<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)loops;
  std::
  vector<absl::Span<const_Vector3<double>_>,_std::allocator<absl::Span<const_Vector3<double>_>_>_>::
  vector((vector<absl::Span<const_Vector3<double>_>,_std::allocator<absl::Span<const_Vector3<double>_>_>_>
          *)local_30);
  __n = std::
        vector<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>,_std::allocator<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>_>_>
        ::size((vector<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>,_std::allocator<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>_>_>
                *)spans.
                  super__Vector_base<absl::Span<const_Vector3<double>_>,_std::allocator<absl::Span<const_Vector3<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<absl::Span<const_Vector3<double>_>,_std::allocator<absl::Span<const_Vector3<double>_>_>_>::
  reserve((vector<absl::Span<const_Vector3<double>_>,_std::allocator<absl::Span<const_Vector3<double>_>_>_>
           *)local_30,__n);
  this_00 = spans.
            super__Vector_base<absl::Span<const_Vector3<double>_>,_std::allocator<absl::Span<const_Vector3<double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage;
  __end1 = std::
           vector<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>,_std::allocator<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>_>_>
           ::begin((vector<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>,_std::allocator<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>_>_>
                    *)spans.
                      super__Vector_base<absl::Span<const_Vector3<double>_>,_std::allocator<absl::Span<const_Vector3<double>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  loop = (Loop *)std::
                 vector<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>,_std::allocator<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>_>_>
                 ::end((vector<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>,_std::allocator<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>_>_>
                        *)this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>_*,_std::vector<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>,_std::allocator<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>_>_>_>
                                *)&loop);
    if (!bVar1) break;
    __args = __gnu_cxx::
             __normal_iterator<const_std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>_*,_std::vector<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>,_std::allocator<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>_>_>_>
             ::operator*(&__end1);
    std::vector<absl::Span<Vector3<double>const>,std::allocator<absl::Span<Vector3<double>const>>>::
    emplace_back<std::vector<Vector3<double>,std::allocator<Vector3<double>>>const&>
              ((vector<absl::Span<Vector3<double>const>,std::allocator<absl::Span<Vector3<double>const>>>
                *)local_30,__args);
    __gnu_cxx::
    __normal_iterator<const_std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>_*,_std::vector<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>,_std::allocator<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>_>_>_>
    ::operator++(&__end1);
  }
  Init(this,(vector<absl::Span<const_Vector3<double>_>,_std::allocator<absl::Span<const_Vector3<double>_>_>_>
             *)local_30);
  std::
  vector<absl::Span<const_Vector3<double>_>,_std::allocator<absl::Span<const_Vector3<double>_>_>_>::
  ~vector((vector<absl::Span<const_Vector3<double>_>,_std::allocator<absl::Span<const_Vector3<double>_>_>_>
           *)local_30);
  return;
}

Assistant:

void S2LaxPolygonShape::Init(const vector<S2LaxPolygonShape::Loop>& loops) {
  vector<Span<const S2Point>> spans;
  spans.reserve(loops.size());
  for (const S2LaxPolygonShape::Loop& loop : loops) {
    spans.emplace_back(loop);
  }
  Init(spans);
}